

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::setPose(btSoftBody *this,bool bvolume,bool bframe)

{
  btVector3 *this_00;
  int newsize;
  Node *pNVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  btMatrix3x3 *pbVar4;
  btMatrix3x3 *pbVar5;
  btVector3 *pbVar6;
  ulong uVar7;
  btScalar *pbVar8;
  ulong uVar9;
  long lVar10;
  btVector3 *pbVar11;
  uint uVar12;
  btScalar bVar13;
  float fVar14;
  btVector3 bVar15;
  btVector3 local_80;
  btVector3 mq;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  btVector3 com;
  
  (this->m_pose).m_bvolume = bvolume;
  (this->m_pose).m_bframe = bframe;
  bVar13 = getTotalMass(this);
  newsize = (this->m_nodes).m_size;
  fVar14 = (float)newsize * bVar13 * 1000.0;
  auVar3._12_4_ = 0;
  auVar3._0_4_ = mq.m_floats[1];
  auVar3._4_4_ = mq.m_floats[2];
  auVar3._8_4_ = mq.m_floats[3];
  mq.m_floats = (btScalar  [4])(auVar3 << 0x20);
  btAlignedObjectArray<float>::resize(&(this->m_pose).m_wgh,newsize,mq.m_floats);
  uVar12 = (this->m_nodes).m_size;
  pNVar1 = (this->m_nodes).m_data;
  uVar9 = 0;
  uVar7 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 * 0x78 - uVar9 != 0; uVar9 = uVar9 + 0x78) {
    uVar12 = -(uint)(0.0 < *(float *)((long)(&pNVar1->m_n + 1) + uVar9));
    bVar13 = (btScalar)(uVar12 & (uint)bVar13 | ~uVar12 & (uint)(fVar14 + bVar13));
  }
  pfVar2 = (this->m_pose).m_wgh.m_data;
  pbVar8 = &pNVar1->m_im;
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    uVar12 = -(uint)(0.0 < *pbVar8);
    pfVar2[uVar9] =
         (float)(~uVar12 & (uint)(fVar14 / bVar13) | (uint)(1.0 / (bVar13 * *pbVar8)) & uVar12);
    pbVar8 = pbVar8 + 0x1e;
  }
  com = evaluateCom(this);
  btAlignedObjectArray<btVector3>::resize(&(this->m_pose).m_pos,(this->m_nodes).m_size,&mq);
  uVar12 = (this->m_nodes).m_size;
  uVar9 = 0;
  uVar7 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar7 = uVar9;
  }
  lVar10 = 0x10;
  for (; uVar7 * 0x10 != uVar9; uVar9 = uVar9 + 0x10) {
    bVar15 = operator-((btVector3 *)
                       ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                               super_Element.m_tag + lVar10),&com);
    *(btScalar (*) [4])((long)((this->m_pose).m_pos.m_data)->m_floats + uVar9) = bVar15.m_floats;
    lVar10 = lVar10 + 0x78;
  }
  bVar13 = 0.0;
  if (bvolume) {
    bVar13 = getVolume(this);
  }
  (this->m_pose).m_volume = bVar13;
  *(undefined8 *)(this->m_pose).m_com.m_floats = com.m_floats._0_8_;
  *(undefined8 *)((this->m_pose).m_com.m_floats + 2) = com.m_floats._8_8_;
  (this->m_pose).m_rot.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_pose).m_rot;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_rot.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_rot.m_el[1].m_floats[1] = 1.0;
  pbVar6 = (this->m_pose).m_rot.m_el;
  pbVar6[1].m_floats[2] = 0.0;
  pbVar6[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_pose).m_rot;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  pbVar6 = (this->m_pose).m_rot.m_el;
  pbVar6[2].m_floats[2] = 1.0;
  pbVar6[2].m_floats[3] = 0.0;
  (this->m_pose).m_scl.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_pose).m_scl;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_scl.m_el[1].m_floats[1] = 1.0;
  pbVar6 = (this->m_pose).m_scl.m_el;
  pbVar6[1].m_floats[2] = 0.0;
  pbVar6[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_pose).m_scl;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  (this->m_pose).m_scl.m_el[2].m_floats[2] = 1.0;
  pbVar4 = &(this->m_pose).m_aqq;
  pbVar6 = (this->m_pose).m_aqq.m_el + 2;
  this_00 = (this->m_pose).m_aqq.m_el + 1;
  *(undefined8 *)((this->m_pose).m_scl.m_el[2].m_floats + 3) = 0;
  pbVar5 = &(this->m_pose).m_aqq;
  pbVar5->m_el[0].m_floats[1] = 0.0;
  pbVar5->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[0].m_floats + 3) = 0;
  pbVar11 = (this->m_pose).m_aqq.m_el;
  pbVar11[1].m_floats[1] = 0.0;
  pbVar11[1].m_floats[2] = 0.0;
  (this->m_pose).m_aqq.m_el[2].m_floats[3] = 0.0;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[1].m_floats + 3) = 0;
  pbVar11 = (this->m_pose).m_aqq.m_el;
  pbVar11[2].m_floats[1] = 0.0;
  pbVar11[2].m_floats[2] = 0.0;
  uVar12 = (this->m_nodes).m_size;
  uVar9 = 0;
  uVar7 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar7 = uVar9;
  }
  for (lVar10 = 0; uVar7 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
    pbVar11 = (btVector3 *)((long)((this->m_pose).m_pos.m_data)->m_floats + lVar10);
    mq = operator*(pbVar11,(btScalar *)((long)(this->m_pose).m_wgh.m_data + uVar9));
    local_80 = operator*(pbVar11,mq.m_floats);
    btVector3::operator+=(pbVar4->m_el,&local_80);
    local_80 = operator*(pbVar11,mq.m_floats + 1);
    btVector3::operator+=(this_00,&local_80);
    local_80 = operator*(pbVar11,mq.m_floats + 2);
    btVector3::operator+=(pbVar6,&local_80);
    uVar9 = uVar9 + 4;
  }
  btMatrix3x3::inverse(pbVar4);
  *(undefined8 *)pbVar4->m_el[0].m_floats = mq.m_floats._0_8_;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[0].m_floats + 2) = mq.m_floats._8_8_;
  *(undefined8 *)this_00->m_floats = local_60;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[1].m_floats + 2) = uStack_58;
  *(undefined8 *)pbVar6->m_floats = local_50;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[2].m_floats + 2) = uStack_48;
  updateConstants(this);
  return;
}

Assistant:

void			btSoftBody::setPose(bool bvolume,bool bframe)
{
	m_pose.m_bvolume	=	bvolume;
	m_pose.m_bframe		=	bframe;
	int i,ni;

	/* Weights		*/ 
	const btScalar	omass=getTotalMass();
	const btScalar	kmass=omass*m_nodes.size()*1000;
	btScalar		tmass=omass;
	m_pose.m_wgh.resize(m_nodes.size());
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		if(m_nodes[i].m_im<=0) tmass+=kmass;
	}
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		m_pose.m_wgh[i]=	n.m_im>0					?
			1/(m_nodes[i].m_im*tmass)	:
		kmass/tmass;
	}
	/* Pos		*/ 
	const btVector3	com=evaluateCom();
	m_pose.m_pos.resize(m_nodes.size());
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_pose.m_pos[i]=m_nodes[i].m_x-com;
	}
	m_pose.m_volume	=	bvolume?getVolume():0;
	m_pose.m_com	=	com;
	m_pose.m_rot.setIdentity();
	m_pose.m_scl.setIdentity();
	/* Aqq		*/ 
	m_pose.m_aqq[0]	=
		m_pose.m_aqq[1]	=
		m_pose.m_aqq[2]	=	btVector3(0,0,0);
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		const btVector3&	q=m_pose.m_pos[i];
		const btVector3		mq=m_pose.m_wgh[i]*q;
		m_pose.m_aqq[0]+=mq.x()*q;
		m_pose.m_aqq[1]+=mq.y()*q;
		m_pose.m_aqq[2]+=mq.z()*q;
	}
	m_pose.m_aqq=m_pose.m_aqq.inverse();
	
	updateConstants();
}